

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_urlglob.c
# Opt level: O0

void glob_cleanup(URLGlob **globp)

{
  URLGlob *__ptr;
  URLGlob *glob;
  curl_off_t elem;
  size_t i;
  URLGlob **globp_local;
  
  __ptr = *globp;
  if (__ptr != (URLGlob *)0x0) {
    for (elem = 0; (ulong)elem < __ptr->size; elem = elem + 1) {
      if ((__ptr->pattern[elem].type == UPTSet) &&
         (__ptr->pattern[elem].content.Set.elements != (char **)0x0)) {
        glob = (URLGlob *)__ptr->pattern[elem].content.Set.size;
        while (glob = (URLGlob *)((long)&glob[-1].pos + 7), -1 < (long)glob) {
          free(__ptr->pattern[elem].content.Set.elements[(long)glob]);
          __ptr->pattern[elem].content.Set.elements[(long)glob] = (char *)0x0;
        }
        free(__ptr->pattern[elem].content.Set.elements);
        __ptr->pattern[elem].content.Set.elements = (char **)0x0;
      }
    }
    free(__ptr->glob_buffer);
    __ptr->glob_buffer = (char *)0x0;
    free(__ptr);
    *globp = (URLGlob *)0x0;
  }
  return;
}

Assistant:

void glob_cleanup(struct URLGlob **globp)
{
  size_t i;
  curl_off_t elem;
  struct URLGlob *glob = *globp;

  if(!glob)
    return;

  for(i = 0; i < glob->size; i++) {
    if((glob->pattern[i].type == UPTSet) &&
       (glob->pattern[i].content.Set.elements)) {
      for(elem = glob->pattern[i].content.Set.size - 1;
          elem >= 0;
          --elem) {
        curlx_safefree(glob->pattern[i].content.Set.elements[elem]);
      }
      curlx_safefree(glob->pattern[i].content.Set.elements);
    }
  }
  curlx_safefree(glob->glob_buffer);
  curlx_safefree(glob);
  *globp = NULL;
}